

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderFirstDocid(Fts3Table *pTab,Fts3SegReader *pReader)

{
  int iVar1;
  u8 local_1d;
  int n;
  u8 bEof;
  Fts3SegReader *pFStack_18;
  int rc;
  Fts3SegReader *pReader_local;
  Fts3Table *pTab_local;
  
  n = 0;
  pFStack_18 = pReader;
  pReader_local = (Fts3SegReader *)pTab;
  if ((pTab->bDescIdx == '\0') || (pReader->ppNextElem == (Fts3HashElem **)0x0)) {
    n = fts3SegReaderRequire(pReader,pReader->aDoclist,10);
    if (n == 0) {
      iVar1 = sqlite3Fts3GetVarint(pFStack_18->aDoclist,&pFStack_18->iDocid);
      pFStack_18->pOffsetList = pFStack_18->aDoclist + iVar1;
    }
  }
  else {
    local_1d = '\0';
    pReader->iDocid = 0;
    pReader->nOffsetList = 0;
    sqlite3Fts3DoclistPrev
              (0,pReader->aDoclist,pReader->nDoclist,&pReader->pOffsetList,&pReader->iDocid,
               &pReader->nOffsetList,&local_1d);
  }
  return n;
}

Assistant:

static int fts3SegReaderFirstDocid(Fts3Table *pTab, Fts3SegReader *pReader){
  int rc = SQLITE_OK;
  assert( pReader->aDoclist );
  assert( !pReader->pOffsetList );
  if( pTab->bDescIdx && fts3SegReaderIsPending(pReader) ){
    u8 bEof = 0;
    pReader->iDocid = 0;
    pReader->nOffsetList = 0;
    sqlite3Fts3DoclistPrev(0,
        pReader->aDoclist, pReader->nDoclist, &pReader->pOffsetList, 
        &pReader->iDocid, &pReader->nOffsetList, &bEof
    );
  }else{
    rc = fts3SegReaderRequire(pReader, pReader->aDoclist, FTS3_VARINT_MAX);
    if( rc==SQLITE_OK ){
      int n = sqlite3Fts3GetVarint(pReader->aDoclist, &pReader->iDocid);
      pReader->pOffsetList = &pReader->aDoclist[n];
    }
  }
  return rc;
}